

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O0

bool woff2::WriteFontCollection(FontCollection *font_collection,uint8_t *dst,size_t dst_size)

{
  bool bVar1;
  const_reference pvVar2;
  size_type sVar3;
  value_type *pvVar4;
  value_type *font;
  size_t i_1;
  size_t i;
  size_t offset_table;
  size_t offset;
  size_t dst_size_local;
  uint8_t *dst_local;
  FontCollection *font_collection_local;
  
  offset_table = 0;
  offset = dst_size;
  dst_size_local = (size_t)dst;
  dst_local = (uint8_t *)font_collection;
  if (font_collection->flavor == 0x74746366) {
    StoreU32(0x74746366,&offset_table,dst);
    StoreU32(*(uint32_t *)(dst_local + 4),&offset_table,(uint8_t *)dst_size_local);
    sVar3 = std::vector<woff2::Font,_std::allocator<woff2::Font>_>::size
                      ((vector<woff2::Font,_std::allocator<woff2::Font>_> *)(dst_local + 0x38));
    StoreU32((uint32_t)sVar3,&offset_table,(uint8_t *)dst_size_local);
    i = offset_table;
    for (i_1 = 0; sVar3 = std::vector<woff2::Font,_std::allocator<woff2::Font>_>::size
                                    ((vector<woff2::Font,_std::allocator<woff2::Font>_> *)
                                     (dst_local + 0x38)), i_1 < sVar3; i_1 = i_1 + 1) {
      StoreU32(0,&offset_table,(uint8_t *)dst_size_local);
    }
    if (*(int *)(dst_local + 4) == 0x20000) {
      StoreU32(0,&offset_table,(uint8_t *)dst_size_local);
      StoreU32(0,&offset_table,(uint8_t *)dst_size_local);
      StoreU32(0,&offset_table,(uint8_t *)dst_size_local);
    }
    for (font = (value_type *)0x0;
        pvVar4 = (value_type *)
                 std::vector<woff2::Font,_std::allocator<woff2::Font>_>::size
                           ((vector<woff2::Font,_std::allocator<woff2::Font>_> *)(dst_local + 0x38))
        , font < pvVar4; font = (value_type *)((long)&font->flavor + 1)) {
      pvVar2 = std::vector<woff2::Font,_std::allocator<woff2::Font>_>::operator[]
                         ((vector<woff2::Font,_std::allocator<woff2::Font>_> *)(dst_local + 0x38),
                          (size_type)font);
      StoreU32((uint32_t)offset_table,&i,(uint8_t *)dst_size_local);
      bVar1 = WriteFont(pvVar2,&offset_table,(uint8_t *)dst_size_local,offset);
      if (!bVar1) {
        return false;
      }
    }
    font_collection_local._7_1_ = true;
  }
  else {
    pvVar2 = std::vector<woff2::Font,_std::allocator<woff2::Font>_>::operator[]
                       (&font_collection->fonts,0);
    font_collection_local._7_1_ = WriteFont(pvVar2,&offset_table,(uint8_t *)dst_size_local,offset);
  }
  return font_collection_local._7_1_;
}

Assistant:

bool WriteFontCollection(const FontCollection& font_collection, uint8_t* dst,
                         size_t dst_size) {
  size_t offset = 0;

  // It's simpler if this just a simple sfnt
  if (font_collection.flavor != kTtcFontFlavor) {
    return WriteFont(font_collection.fonts[0], &offset, dst, dst_size);
  }

  // Write TTC header
  StoreU32(kTtcFontFlavor, &offset, dst);
  StoreU32(font_collection.header_version, &offset, dst);
  StoreU32(font_collection.fonts.size(), &offset, dst);

  // Offset Table, zeroed for now
  size_t offset_table = offset;  // where to write offsets later
  for (size_t i = 0; i < font_collection.fonts.size(); i++) {
    StoreU32(0, &offset, dst);
  }

  if (font_collection.header_version == 0x00020000) {
    StoreU32(0, &offset, dst);  // ulDsigTag
    StoreU32(0, &offset, dst);  // ulDsigLength
    StoreU32(0, &offset, dst);  // ulDsigOffset
  }

  // Write fonts and their offsets.
  for (size_t i = 0; i < font_collection.fonts.size(); i++) {
    const auto& font = font_collection.fonts[i];
    StoreU32(offset, &offset_table, dst);
    if (!WriteFont(font, &offset, dst, dst_size)) {
      return false;
    }
  }

  return true;
}